

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzD::ArchiveOUT(ChNodeFEAxyzD *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::fea::ChNodeFEAxyzD>(marchive);
  ChNodeFEAxyz::ArchiveOUT(&this->super_ChNodeFEAxyz,marchive);
  local_30._value = (ChVector<double> *)&(this->super_ChNodeFEAxyz).field_0xf0;
  local_30._name = "D";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->D_dt;
  local_48._name = "D_dt";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->D_dtdt;
  local_60._name = "D_dtdt";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChNodeFEAxyzD::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzD>();
    // serialize parent class
    ChNodeFEAxyz::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(D);
    marchive << CHNVP(D_dt);
    marchive << CHNVP(D_dtdt);
}